

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O1

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_false>::set_use_fast_tape
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_false> *this)

{
  bool bVar1;
  byte bVar2;
  
  if ((this->tape_player_is_sleeping_ == false) && (this->allow_fast_tape_ == true)) {
    bVar1 = Storage::Tape::TapePlayer::has_tape(&(this->tape_player_).super_TapePlayer);
    if ((bVar1) && ((this->primary_slots_ & 3) == 0)) {
      bVar2 = PrimarySlot::secondary_paging(&this->memory_slots_[0].super_PrimarySlot);
      bVar1 = (bVar2 & 3) == 0;
      goto LAB_00356e31;
    }
  }
  bVar1 = false;
LAB_00356e31:
  this->use_fast_tape_ = bVar1;
  return;
}

Assistant:

void set_use_fast_tape() {
			use_fast_tape_ =
				!tape_player_is_sleeping_ &&
				allow_fast_tape_ &&
				tape_player_.has_tape() &&
				!(primary_slots_ & 3) &&
				!(memory_slots_[0].secondary_paging() & 3);
		}